

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbuildmultiphysicsmesh.cpp
# Opt level: O0

void TPZBuildMultiphysicsMesh::TransferFromMultiPhysicsT<double>
               (TPZVec<TPZCompMesh_*> *cmeshVec,TPZCompMesh *MFMesh)

{
  TPZCompMesh *this;
  int iVar1;
  int iVar2;
  int64_t iVar3;
  TPZBlock *this_00;
  pair<TPZCompMesh_*,_long> *ppVar4;
  TPZFMatrix<double> *this_01;
  TPZConnect *this_02;
  int64_t iVar5;
  double *pdVar6;
  TPZCompMesh *in_RSI;
  TPZSubCompMesh *sub;
  TPZCompEl *cel;
  int64_t el;
  int64_t nel;
  int64_t pos;
  double val;
  int idf;
  int64_t seqnumMF;
  TPZConnect *conMF;
  int blsize;
  int64_t seqnum;
  TPZConnect *con;
  int64_t atomicindexconnect;
  TPZBlock *block;
  TPZFMatrix<double> *atomic_mesh_sol;
  TPZCompMesh *atomic_mesh;
  int64_t connect;
  TPZFMatrix<double> *solMF;
  TPZBlock *blockMF;
  int64_t nconnect;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> indexes;
  size_t in_stack_000002d8;
  char *in_stack_000002e0;
  long in_stack_fffffffffffffeb8;
  TPZCompMesh *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffed0;
  double in_stack_fffffffffffffed8;
  TPZBlock *in_stack_fffffffffffffee0;
  TPZCompMesh *in_stack_fffffffffffffee8;
  TPZConnect *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  TPZCompMesh *in_stack_ffffffffffffff00;
  long local_d0;
  int local_ac;
  int64_t local_60;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> local_30;
  TPZCompMesh *local_10;
  
  local_10 = in_RSI;
  TPZVec<std::pair<TPZCompMesh_*,_long>_>::TPZVec(&local_30);
  ComputeAtomicIndexes
            (in_stack_ffffffffffffff00,
             (TPZVec<std::pair<TPZCompMesh_*,_long>_> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  iVar3 = TPZVec<std::pair<TPZCompMesh_*,_long>_>::size(&local_30);
  TPZCompMesh::Block(local_10);
  TPZCompMesh::Solution(local_10);
  this_00 = (TPZBlock *)
            TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                      ((TPZSolutionMatrix *)in_stack_fffffffffffffec0);
  for (local_60 = 0; local_60 < iVar3; local_60 = local_60 + 1) {
    ppVar4 = TPZVec<std::pair<TPZCompMesh_*,_long>_>::operator[](&local_30,local_60);
    this = ppVar4->first;
    if (this != (TPZCompMesh *)0x0) {
      TPZCompMesh::Solution(this);
      this_01 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                          ((TPZSolutionMatrix *)in_stack_fffffffffffffec0);
      TPZCompMesh::Block(this);
      TPZVec<std::pair<TPZCompMesh_*,_long>_>::operator[](&local_30,local_60);
      TPZCompMesh::ConnectVec(this);
      this_02 = TPZChunkVector<TPZConnect,_10>::operator[]
                          ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffee0,
                           (int64_t)in_stack_fffffffffffffed8);
      iVar5 = TPZConnect::SequenceNumber(this_02);
      if (iVar5 < 0) {
        pzinternal::DebugStopImpl(in_stack_000002e0,in_stack_000002d8);
      }
      iVar1 = TPZBlock::Size((TPZBlock *)in_stack_fffffffffffffec0,
                             (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      TPZCompMesh::ConnectVec(local_10);
      in_stack_fffffffffffffef0 =
           TPZChunkVector<TPZConnect,_10>::operator[]
                     ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffee0,
                      (int64_t)in_stack_fffffffffffffed8);
      iVar5 = TPZConnect::SequenceNumber(in_stack_fffffffffffffef0);
      if (iVar5 < 0) {
        pzinternal::DebugStopImpl(in_stack_000002e0,in_stack_000002d8);
      }
      for (local_ac = 0; local_ac < iVar1; local_ac = local_ac + 1) {
        in_stack_fffffffffffffee0 = this_00;
        in_stack_fffffffffffffee8 =
             (TPZCompMesh *)
             TPZBlock::Index(this_00,(int64_t)in_stack_fffffffffffffed8,
                             (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
        pdVar6 = TPZFMatrix<double>::operator()
                           ((TPZFMatrix<double> *)in_stack_fffffffffffffee0,
                            (int64_t)in_stack_fffffffffffffee8);
        in_stack_fffffffffffffed8 = *pdVar6;
        iVar2 = TPZBlock::Position((TPZBlock *)in_stack_fffffffffffffec0,
                                   (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
        pdVar6 = TPZFMatrix<double>::operator()(this_01,(long)iVar2 + (long)local_ac);
        *pdVar6 = in_stack_fffffffffffffed8;
      }
    }
  }
  iVar3 = TPZCompMesh::NElements((TPZCompMesh *)0x1e43a0b);
  for (local_d0 = 0; local_d0 < iVar3; local_d0 = local_d0 + 1) {
    in_stack_fffffffffffffec0 =
         (TPZCompMesh *)TPZCompMesh::Element(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    if (in_stack_fffffffffffffec0 == (TPZCompMesh *)0x0) {
      in_stack_fffffffffffffeb8 = 0;
    }
    else {
      in_stack_fffffffffffffeb8 =
           __dynamic_cast(in_stack_fffffffffffffec0,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,
                          0x918);
    }
    if (in_stack_fffffffffffffeb8 != 0) {
      TransferFromMultiPhysics
                ((TPZVec<TPZCompMesh_*> *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    }
  }
  TPZVec<std::pair<TPZCompMesh_*,_long>_>::~TPZVec
            ((TPZVec<std::pair<TPZCompMesh_*,_long>_> *)in_stack_fffffffffffffec0);
  return;
}

Assistant:

void TPZBuildMultiphysicsMesh::TransferFromMultiPhysicsT(TPZVec<TPZCompMesh *> &cmeshVec, TPZCompMesh *MFMesh)
{
    
    TPZVec<atomic_index> indexes;
    ComputeAtomicIndexes(MFMesh, indexes);
    int64_t nconnect = indexes.size();
    TPZBlock &blockMF = MFMesh->Block();
    TPZFMatrix<TVar> &solMF = MFMesh->Solution();
    for(int64_t connect = 0; connect < nconnect; connect++)
    {
        TPZCompMesh *atomic_mesh = indexes[connect].first;
        //TODOCOMPLEX
        if(!atomic_mesh) continue;
        TPZFMatrix<TVar> &atomic_mesh_sol = atomic_mesh->Solution();
        TPZBlock &block = atomic_mesh->Block();
        int64_t atomicindexconnect = indexes[connect].second;
        TPZConnect &con = atomic_mesh->ConnectVec()[atomicindexconnect];
        int64_t seqnum = con.SequenceNumber();
        if(seqnum<0) DebugStop();       /// Whether connect was deleted by previous refined process
        int blsize = block.Size(seqnum);
        TPZConnect &conMF = MFMesh->ConnectVec()[connect];
        int64_t seqnumMF = conMF.SequenceNumber();
        if(seqnumMF < 0) DebugStop();
        for (int idf=0; idf<blsize; idf++) {
            TVar val = solMF(blockMF.Index(seqnumMF, idf));
            int64_t pos = block.Position(seqnum);
            atomic_mesh_sol(pos+idf) = val;
        }
    }
    
    int64_t nel = MFMesh->NElements();
    for (int64_t el = 0; el<nel; el++) {
        TPZCompEl *cel = MFMesh->Element(el);
        TPZSubCompMesh *sub = dynamic_cast<TPZSubCompMesh *>(cel);
        if(sub)
        {
            TransferFromMultiPhysics(cmeshVec, sub);
        }
    }
}